

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

int __thiscall pbrt::AliasTable::Sample(AliasTable *this,Float u,Float *pdfOut,Float *uRemapped)

{
  Bin *pBVar1;
  size_t sVar2;
  Bin *pBVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  undefined1 in_register_00001204 [60];
  undefined1 auVar7 [64];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar10 [16];
  undefined1 in_ZMM3 [64];
  
  auVar7._4_60_ = in_register_00001204;
  auVar7._0_4_ = u;
  sVar2 = (this->bins).nStored;
  auVar4 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,sVar2);
  iVar6 = (int)(auVar4._0_4_ * u);
  iVar5 = (int)sVar2 + -1;
  if (iVar6 <= iVar5) {
    iVar5 = iVar6;
  }
  auVar10._0_4_ = (float)iVar5;
  auVar10._4_12_ = in_ZMM3._4_12_;
  pBVar3 = (this->bins).ptr;
  auVar4 = vfmsub231ss_fma(auVar10,auVar7._0_16_,auVar4);
  auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar4);
  pBVar1 = pBVar3 + iVar5;
  fVar8 = auVar4._0_4_;
  if (pBVar1->q <= fVar8) {
    iVar5 = pBVar1->alias;
    if (pdfOut != (Float *)0x0) {
      *pdfOut = pBVar3[iVar5].pdf;
    }
    if (uRemapped == (Float *)0x0) {
      return iVar5;
    }
    auVar9._0_4_ = (fVar8 - pBVar1->q) / (1.0 - pBVar1->q);
    auVar9._4_12_ = SUB6012((undefined1  [60])0x0,0);
  }
  else {
    if (pdfOut != (Float *)0x0) {
      *pdfOut = pBVar1->pdf;
    }
    if (uRemapped == (Float *)0x0) {
      return iVar5;
    }
    auVar9._0_4_ = fVar8 / pBVar1->q;
    auVar9._4_12_ = auVar4._4_12_;
  }
  auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar9);
  *uRemapped = auVar4._0_4_;
  return iVar5;
}

Assistant:

PBRT_CPU_GPU
    size_t size() const { return nStored; }